

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  short sVar2;
  ushort uVar3;
  NameContext *pNVar4;
  Parse *pParse;
  _func_void_sqlite3_context_ptr *p_Var5;
  SrcList *pSVar6;
  Table *pTVar7;
  IdList *pIVar8;
  IdList_item *pIVar9;
  ExprList *pEList;
  Db *pDVar10;
  bool bVar11;
  bool bVar12;
  u8 uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  size_t sVar19;
  FuncDef *pFVar20;
  Expr *pEVar21;
  Select *pSVar22;
  ushort uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  sqlite3 *psVar27;
  ulong uVar28;
  ulong uVar29;
  char *pcVar30;
  char *pcVar31;
  long lVar32;
  Column *pCVar33;
  char *pcVar34;
  Schema **ppSVar35;
  char **ppcVar36;
  long lVar37;
  NameContext *pNVar38;
  int iVar39;
  uint uVar40;
  uint uVar41;
  SrcList_item *pSVar42;
  bool bVar43;
  Walker w;
  char *local_108;
  SrcList_item *local_f0;
  Schema *local_e0;
  NameContext *local_d0;
  Table **local_c0;
  int *local_a0;
  Table **local_78;
  SrcList *local_70;
  undefined8 local_68;
  Walker local_60;
  
  pNVar4 = (pWalker->u).pNC;
  pParse = pNVar4->pParse;
  uVar26 = (uint)pExpr->op;
  if (uVar26 < 0x77) {
    uVar28 = (ulong)(uVar26 - 0x14);
    if (0x3e < uVar26 - 0x14) goto LAB_00160f4c;
    if ((0x7e30000000000000U >> (uVar28 & 0x3f) & 1) == 0) {
      if ((0x40000000000001U >> (uVar28 & 0x3f) & 1) != 0) goto LAB_00160e32;
      if (uVar28 != 7) goto LAB_00160f4c;
      pcVar31 = (char *)0x0;
      pEVar21 = pExpr;
LAB_00160ded:
      local_108 = (pEVar21->u).zToken;
      psVar27 = pParse->db;
      pExpr->iTable = -1;
      pExpr->pTab = (Table *)0x0;
      pcVar34 = pcVar31;
LAB_00160fd6:
      local_e0 = (Schema *)0x0;
      pcVar31 = (char *)0x0;
      goto LAB_00160fd8;
    }
  }
  else {
    if (uVar26 < 0x87) {
      if (uVar26 == 0x77) {
LAB_00160e32:
        if ((pExpr->flags & 0x800) != 0) {
          iVar25 = pNVar4->nRef;
          notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar4->ncFlags,"subqueries",0x26);
          sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
          if (iVar25 != pNVar4->nRef) {
            *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
            *(byte *)&pNVar4->ncFlags = (byte)pNVar4->ncFlags | 0x40;
          }
        }
        goto LAB_00160f4c;
      }
      if (uVar26 != 0x7a) goto LAB_00160f4c;
      notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar4->ncFlags,"the \".\" operator",0x20);
      pEVar21 = pExpr->pRight;
      pcVar31 = (pExpr->pLeft->u).zToken;
      if (pEVar21->op == '\x1b') goto LAB_00160ded;
      pcVar34 = (pEVar21->pLeft->u).zToken;
      local_108 = (pEVar21->pRight->u).zToken;
      psVar27 = pParse->db;
      pExpr->iTable = -1;
      pExpr->pTab = (Table *)0x0;
      if ((pcVar31 == (char *)0x0) || ((pNVar4->ncFlags & 6) != 0)) goto LAB_00160fd6;
      iVar25 = psVar27->nDb;
      if ((long)iVar25 < 1) {
        local_e0 = (Schema *)0x0;
      }
      else {
        pDVar10 = psVar27->aDb;
        local_e0 = (Schema *)0x0;
        lVar32 = 0;
        do {
          iVar17 = sqlite3StrICmp(*(char **)((long)&pDVar10->zDbSName + lVar32),pcVar31);
          if (iVar17 == 0) {
            local_e0 = *(Schema **)((long)&pDVar10->pSchema + lVar32);
            break;
          }
          lVar32 = lVar32 + 0x20;
        } while ((long)iVar25 * 0x20 != lVar32);
      }
LAB_00160fd8:
      local_78 = &pExpr->pTab;
      local_a0 = &pExpr->iTable;
      bVar43 = pcVar34 == (char *)0x0;
      local_c0 = &pParse->pTriggerTab;
      iVar25 = 0;
      local_f0 = (SrcList_item *)0x0;
      bVar12 = false;
      iVar17 = 0;
      local_d0 = pNVar4;
LAB_00161030:
      pSVar6 = local_d0->pSrcList;
      if (pSVar6 == (SrcList *)0x0) {
        iVar39 = 0;
      }
      else {
        iVar18 = pSVar6->nSrc;
        if (iVar18 < 1) {
          iVar39 = 0;
        }
        else {
          pSVar42 = pSVar6->a;
          iVar24 = 0;
          iVar39 = 0;
          do {
            pTVar7 = pSVar42->pTab;
            pSVar22 = pSVar42->pSelect;
            if ((pSVar22 == (Select *)0x0) || ((pSVar22->selFlags & 0x800) == 0)) {
LAB_0016112e:
              if ((pcVar31 == (char *)0x0) || (pTVar7->pSchema == local_e0)) {
                if (pcVar34 != (char *)0x0) {
                  pcVar30 = pSVar42->zAlias;
                  if (pcVar30 == (char *)0x0) {
                    pcVar30 = pTVar7->zName;
                  }
                  iVar14 = sqlite3StrICmp(pcVar30,pcVar34);
                  if (iVar14 != 0) goto LAB_00161280;
                }
                iVar14 = iVar17 + 1;
                if (iVar17 == 0) {
                  local_f0 = pSVar42;
                }
                sVar2 = pTVar7->nCol;
                iVar17 = iVar14;
                if (0 < sVar2) {
                  pCVar33 = pTVar7->aCol;
                  iVar14 = 0;
                  do {
                    iVar15 = sqlite3StrICmp(pCVar33->zName,local_108);
                    if (iVar15 == 0) {
                      if (iVar39 != 1) {
LAB_00161241:
                        iVar39 = iVar39 + 1;
                        if (iVar14 == pTVar7->iPKey) {
                          iVar14 = 0xffff;
                        }
                        pExpr->iColumn = (ynVar)iVar14;
                        local_f0 = pSVar42;
                        break;
                      }
                      if (((pSVar42->fg).jointype & 4) == 0) {
                        pIVar8 = pSVar42->pUsing;
                        if ((pIVar8 == (IdList *)0x0) || (iVar15 = pIVar8->nId, (long)iVar15 < 1))
                        goto LAB_00161241;
                        pIVar9 = pIVar8->a;
                        lVar32 = 0;
                        while (iVar16 = sqlite3StrICmp(*(char **)((long)&pIVar9->zName + lVar32),
                                                       local_108), iVar16 != 0) {
                          lVar32 = lVar32 + 0x10;
                          if ((long)iVar15 * 0x10 == lVar32) goto LAB_00161241;
                        }
                      }
                    }
                    iVar14 = iVar14 + 1;
                    pCVar33 = pCVar33 + 1;
                  } while (iVar14 != sVar2);
                }
              }
            }
            else {
              lVar32 = (long)pSVar22->pEList->nExpr;
              bVar11 = false;
              if (0 < lVar32) {
                ppcVar36 = &pSVar22->pEList->a[0].zSpan;
                lVar37 = 0;
                do {
                  iVar14 = sqlite3MatchSpanName(*ppcVar36,local_108,pcVar34,pcVar31);
                  if (iVar14 != 0) {
                    iVar39 = iVar39 + 1;
                    pExpr->iColumn = (ynVar)lVar37;
                    bVar11 = true;
                    iVar17 = 2;
                    local_f0 = pSVar42;
                  }
                  lVar37 = lVar37 + 1;
                  ppcVar36 = ppcVar36 + 4;
                } while (lVar32 != lVar37);
              }
              if (pcVar34 != (char *)0x0 && !bVar11) goto LAB_0016112e;
            }
LAB_00161280:
            iVar24 = iVar24 + 1;
            pSVar42 = pSVar42 + 1;
          } while (iVar24 != iVar18);
        }
        if (local_f0 == (SrcList_item *)0x0) {
          local_f0 = (SrcList_item *)0x0;
        }
        else {
          *local_a0 = local_f0->iCursor;
          pTVar7 = local_f0->pTab;
          *local_78 = pTVar7;
          if (((local_f0->fg).jointype & 8) != 0) {
            pbVar1 = (byte *)((long)&pExpr->flags + 2);
            *pbVar1 = *pbVar1 | 0x10;
          }
          local_e0 = pTVar7->pSchema;
        }
      }
      if (iVar17 != 0 || (bVar43 || pcVar31 != (char *)0x0)) {
LAB_001614c3:
        if ((((iVar39 == 0) && (iVar17 == 1)) && (local_f0 != (SrcList_item *)0x0)) &&
           (iVar17 = 1, (local_d0->ncFlags & 0x20) == 0)) {
          iVar17 = sqlite3IsRowid(local_108);
          if (iVar17 == 0) {
            iVar17 = 1;
            goto LAB_00161513;
          }
          iVar17 = 1;
          if ((local_f0->pTab->tabFlags & 0x40) != 0) goto LAB_00161513;
          pExpr->iColumn = -1;
          pExpr->affinity = 'D';
          goto LAB_00161632;
        }
LAB_00161513:
        bVar11 = bVar43;
        if (((pcVar34 != (char *)0x0) || (iVar39 != 0)) ||
           (pEList = local_d0->pEList, pEList == (ExprList *)0x0)) goto LAB_001615ac;
        iVar39 = pEList->nExpr;
        if (0 < (long)iVar39) {
          ppcVar36 = &pEList->a[0].zName;
          lVar32 = 0;
          do {
            pcVar30 = *ppcVar36;
            if ((pcVar30 != (char *)0x0) &&
               (iVar18 = sqlite3StrICmp(pcVar30,local_108), iVar18 == 0)) {
              pEVar21 = ((ExprList_item *)(ppcVar36 + -1))->pExpr;
              if (((local_d0->ncFlags & 1) == 0) && ((pEVar21->flags & 2) != 0)) {
                sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar30);
                return 2;
              }
              uVar13 = pEVar21->op;
              if (uVar13 == 0x9d) {
                uVar13 = pEVar21->op2;
              }
              if (uVar13 == 'w') {
                pSVar22 = (pEVar21->x).pSelect;
LAB_001616bf:
                if (((anon_union_8_2_a01b6dbf_for_x *)&pSVar22->pEList)->pList->nExpr != 1) {
                  sqlite3ErrorMsg(pParse,"row value misused");
                  return 2;
                }
              }
              else if (uVar13 == 0x9e) {
                pSVar22 = (Select *)&pEVar21->x;
                goto LAB_001616bf;
              }
              resolveAlias(pParse,pEList,(int)lVar32,pExpr,"",iVar25);
              uVar26 = pExpr->flags;
              goto LAB_00161962;
            }
            lVar32 = lVar32 + 1;
            ppcVar36 = ppcVar36 + 4;
          } while (iVar39 != lVar32);
        }
        local_d0 = local_d0->pNext;
        if (local_d0 == (NameContext *)0x0) goto LAB_00161679;
      }
      else {
        pTVar7 = *local_c0;
        if (pTVar7 == (Table *)0x0) {
          iVar17 = 0;
          bVar11 = false;
        }
        else {
          uVar13 = pParse->eTriggerOp;
          if (uVar13 == 'm') {
LAB_00161343:
            iVar18 = sqlite3StrICmp("old",pcVar34);
            iVar17 = 0;
            if (iVar18 == 0) {
              bVar11 = true;
LAB_00161395:
              *local_a0 = iVar17;
              local_e0 = pTVar7->pSchema;
              uVar26 = (uint)pTVar7->nCol;
              if (pTVar7->nCol < 1) {
                uVar41 = 0;
LAB_00161404:
                if ((int)uVar26 <= (int)uVar41) goto LAB_0016140e;
              }
              else {
                pCVar33 = pTVar7->aCol;
                uVar40 = 0;
                do {
                  iVar17 = sqlite3StrICmp(pCVar33->zName,local_108);
                  if (iVar17 == 0) {
                    uVar41 = uVar40;
                    if ((int)pTVar7->iPKey == uVar40) {
                      uVar41 = 0xffffffff;
                    }
                    goto LAB_00161404;
                  }
                  uVar40 = uVar40 + 1;
                  pCVar33 = pCVar33 + 1;
                  uVar41 = uVar26;
                } while (uVar26 != uVar40);
LAB_0016140e:
                iVar17 = sqlite3IsRowid(local_108);
                if (iVar17 != 0) {
                  uVar41 = uVar41 | -(uint)((pTVar7->tabFlags & 0x40) == 0);
                }
              }
              iVar17 = 1;
              if ((int)uVar41 < (int)uVar26) {
                if ((int)uVar41 < 0) {
                  pExpr->affinity = 'D';
                }
                else {
                  uVar26 = 1 << ((byte)uVar41 & 0x1f);
                  if (0x1f < uVar41) {
                    uVar26 = 0xffffffff;
                  }
                  if (bVar11) {
                    pParse->oldmask = pParse->oldmask | uVar26;
                  }
                  else {
                    pParse->newmask = pParse->newmask | uVar26;
                  }
                }
                iVar39 = iVar39 + 1;
                pExpr->iColumn = (ynVar)uVar41;
                pExpr->pTab = pTVar7;
                bVar12 = true;
              }
              goto LAB_001614c3;
            }
          }
          else {
            iVar17 = sqlite3StrICmp("new",pcVar34);
            if (iVar17 == 0) {
              iVar17 = 1;
              bVar11 = false;
              goto LAB_00161395;
            }
            if (uVar13 != 'l') goto LAB_00161343;
          }
          iVar17 = 0;
          bVar11 = false;
        }
LAB_001615ac:
        if (iVar39 != 0) {
          if (iVar39 != 1) {
            pcVar30 = "ambiguous column name";
            goto LAB_00161694;
          }
LAB_00161632:
          bVar43 = true;
          goto LAB_001618d2;
        }
        local_d0 = local_d0->pNext;
        if (local_d0 == (NameContext *)0x0) {
          if (!bVar11) goto LAB_00161684;
LAB_00161679:
          if ((pExpr->flags & 0x40) != 0) {
            pExpr->op = 'a';
            pExpr->pTab = (Table *)0x0;
            return 1;
          }
LAB_00161684:
          pcVar30 = "no such column";
          local_d0 = (NameContext *)0x0;
LAB_00161694:
          if (pcVar31 == (char *)0x0) {
            if (pcVar34 == (char *)0x0) {
              sqlite3ErrorMsg(pParse,"%s: %s",pcVar30,local_108);
            }
            else {
              sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar30,pcVar34,local_108);
            }
          }
          else {
            sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar30,pcVar31,pcVar34,local_108);
          }
          pParse->checkSchema = '\x01';
          pNVar4->nErr = pNVar4->nErr + 1;
          bVar43 = false;
LAB_001618d2:
          uVar3 = pExpr->iColumn;
          if ((-1 < (short)uVar3) && (local_f0 != (SrcList_item *)0x0)) {
            uVar23 = 0x3f;
            if (uVar3 < 0x3f) {
              uVar23 = uVar3;
            }
            local_f0->colUsed = local_f0->colUsed | 1L << ((byte)uVar23 & 0x3f);
          }
          if (pExpr->pLeft != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar27,pExpr->pLeft);
          }
          pExpr->pLeft = (Expr *)0x0;
          if (pExpr->pRight != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar27,pExpr->pRight);
          }
          pExpr->pRight = (Expr *)0x0;
          uVar13 = '=';
          if (!bVar12) {
            uVar13 = 0x98;
          }
          pExpr->op = uVar13;
          uVar26 = pExpr->flags | 0x800000;
          pExpr->flags = uVar26;
          if (!bVar43) {
            return 2;
          }
LAB_00161962:
          if ((((uVar26 >> 0x16 & 1) == 0) && (local_e0 != (Schema *)0x0)) &&
             (psVar27 = pParse->db, psVar27->xAuth != (sqlite3_xauth)0x0)) {
            uVar26 = psVar27->nDb;
            if ((int)uVar26 < 1) {
              iVar25 = 0;
            }
            else {
              ppSVar35 = &psVar27->aDb->pSchema;
              uVar28 = 0;
              do {
                uVar29 = uVar28;
                if (*ppSVar35 == local_e0) break;
                uVar28 = uVar28 + 1;
                ppSVar35 = ppSVar35 + 4;
                uVar29 = (ulong)uVar26;
              } while (uVar26 != uVar28);
              iVar25 = (int)uVar29;
              if (iVar25 < 0) goto LAB_00161a46;
            }
            if (pExpr->op == '=') {
LAB_001619cd:
              pTVar7 = *local_c0;
              if (pTVar7 != (Table *)0x0) {
                lVar32 = (long)pExpr->iColumn;
                if ((pExpr->iColumn < 0) && (lVar32 = (long)pTVar7->iPKey, lVar32 < 0)) {
                  pcVar31 = "ROWID";
                }
                else {
                  pcVar31 = pTVar7->aCol[lVar32].zName;
                }
                iVar25 = sqlite3AuthReadCol(pParse,pTVar7->zName,pcVar31,iVar25);
                if (iVar25 == 2) {
                  pExpr->op = 'e';
                }
              }
            }
            else {
              lVar32 = (long)local_d0->pSrcList->nSrc;
              if (0 < lVar32) {
                local_c0 = &local_d0->pSrcList->a[0].pTab;
                do {
                  if (*local_a0 == *(int *)((long)local_c0 + 0x24)) goto LAB_001619cd;
                  local_c0 = local_c0 + 0xe;
                  lVar32 = lVar32 + -1;
                } while (lVar32 != 0);
              }
            }
          }
LAB_00161a46:
          pNVar4->nRef = pNVar4->nRef + 1;
          while (local_d0 != pNVar4) {
            pNVar4 = pNVar4->pNext;
            pNVar4->nRef = pNVar4->nRef + 1;
          }
          return 1;
        }
      }
      iVar25 = iVar25 + 1;
      goto LAB_00161030;
    }
    if (uVar26 == 0x87) {
      notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar4->ncFlags,"parameters",0x26);
      goto LAB_00160f4c;
    }
    if (uVar26 != 0x94) {
      if (uVar26 != 0x97) goto LAB_00160f4c;
      pSVar22 = (pExpr->x).pSelect;
      uVar28 = 0;
      iVar25 = 0;
      if (pSVar22 != (Select *)0x0) {
        iVar25 = *(int *)&pSVar22->pEList;
      }
      psVar27 = pParse->db;
      uVar13 = psVar27->enc;
      pcVar31 = (pExpr->u).zToken;
      if (pcVar31 != (char *)0x0) {
        sVar19 = strlen(pcVar31);
        uVar28 = (ulong)((uint)sVar19 & 0x3fffffff);
      }
      pFVar20 = sqlite3FindFunction(psVar27,pcVar31,iVar25,uVar13,'\0');
      if (pFVar20 == (FuncDef *)0x0) {
        pFVar20 = sqlite3FindFunction(pParse->db,pcVar31,-2,uVar13,'\0');
        if (pFVar20 == (FuncDef *)0x0) {
          if ((pParse->db->init).busy != '\0') goto LAB_00161839;
          pcVar34 = "no such function: %.*s";
        }
        else {
          pcVar34 = "wrong number of arguments to function %.*s()";
        }
      }
      else {
        p_Var5 = pFVar20->xFinalize;
        if ((pFVar20->funcFlags & 0x400) != 0) {
          pExpr->flags = pExpr->flags | 0x41000;
          if (iVar25 == 2) {
            iVar25 = exprProbability(pSVar22->pWhere);
            pExpr->iTable = iVar25;
            if (iVar25 < 0) {
              sqlite3ErrorMsg(pParse,
                              "second argument to likelihood() must be a constant between 0.0 and 1.0"
                             );
              pNVar4->nErr = pNVar4->nErr + 1;
            }
          }
          else {
            iVar25 = 0x7800000;
            if (*pFVar20->zName == 'u') {
              iVar25 = 0x800000;
            }
            pExpr->iTable = iVar25;
          }
        }
        iVar25 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFVar20->zName,(char *)0x0);
        if (iVar25 != 0) {
          if (iVar25 == 1) {
            sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFVar20->zName);
            pNVar4->nErr = pNVar4->nErr + 1;
          }
          pExpr->op = 'e';
          return 1;
        }
        uVar3 = pFVar20->funcFlags;
        if ((uVar3 & 0x2800) != 0) {
          pbVar1 = (byte *)((long)&pExpr->flags + 2);
          *pbVar1 = *pbVar1 | 8;
        }
        if ((uVar3 >> 0xb & 1) == 0) {
          notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar4->ncFlags,
                   "non-deterministic functions",0x22);
        }
        if (p_Var5 == (_func_void_sqlite3_context_ptr *)0x0) goto LAB_00161839;
        if ((pNVar4->ncFlags & 1) != 0) {
          pNVar4->ncFlags = pNVar4->ncFlags & 0xfffe;
          sqlite3WalkExprList(pWalker,(ExprList *)pSVar22);
          pExpr->op = 0x99;
          pExpr->op2 = '\0';
          pNVar38 = pNVar4;
          while( true ) {
            local_70 = pNVar38->pSrcList;
            local_60.xExprCallback = exprSrcCount;
            local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
            local_68 = 0;
            local_60.u.pNC = (NameContext *)&local_70;
            sqlite3WalkExprList(&local_60,(pExpr->x).pList);
            if ((0 < (int)local_68) || (local_68._4_4_ == 0)) break;
            pExpr->op2 = pExpr->op2 + '\x01';
            pNVar38 = pNVar38->pNext;
            if (pNVar38 == (NameContext *)0x0) {
LAB_00161b5c:
              *(byte *)&pNVar4->ncFlags = (byte)pNVar4->ncFlags | 1;
              return 1;
            }
          }
          pNVar38->ncFlags = pFVar20->funcFlags & 0x1000 | pNVar38->ncFlags | 0x10;
          goto LAB_00161b5c;
        }
        pcVar34 = "misuse of aggregate function %.*s()";
      }
      sqlite3ErrorMsg(pParse,pcVar34,uVar28,pcVar31);
      pNVar4->nErr = pNVar4->nErr + 1;
LAB_00161839:
      sqlite3WalkExprList(pWalker,(ExprList *)pSVar22);
      return 1;
    }
  }
  if (pParse->db->mallocFailed != '\0') goto LAB_00160f4c;
  pEVar21 = pExpr->pLeft;
  uVar13 = pEVar21->op;
  if (uVar13 == 0x9d) {
    uVar13 = pEVar21->op2;
  }
  if (uVar13 == 'w') {
    pSVar22 = (pEVar21->x).pSelect;
LAB_00160e98:
    iVar25 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar22->pEList)->pList->nExpr;
  }
  else {
    iVar25 = 1;
    if (uVar13 == 0x9e) {
      pSVar22 = (Select *)&pEVar21->x;
      goto LAB_00160e98;
    }
  }
  if (pExpr->op == 0x49) {
    pEVar21 = ((pExpr->x).pList)->a[0].pExpr;
    uVar13 = pEVar21->op;
    if (uVar13 == 0x9d) {
      uVar13 = pEVar21->op2;
    }
    if (uVar13 == 'w') {
      pSVar22 = (pEVar21->x).pSelect;
LAB_00160efc:
      iVar17 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar22->pEList)->pList->nExpr;
    }
    else {
      iVar17 = 1;
      if (uVar13 == 0x9e) {
        pSVar22 = (Select *)&pEVar21->x;
        goto LAB_00160efc;
      }
    }
    if (iVar17 == iVar25) {
      pEVar21 = *(Expr **)((pExpr->x).pList + 1);
      goto LAB_00160f09;
    }
  }
  else {
    pEVar21 = pExpr->pRight;
LAB_00160f09:
    uVar13 = pEVar21->op;
    if (uVar13 == 0x9d) {
      uVar13 = pEVar21->op2;
    }
    if (uVar13 == 'w') {
      pSVar22 = (pEVar21->x).pSelect;
    }
    else {
      iVar17 = 1;
      if (uVar13 != 0x9e) goto LAB_00160f37;
      pSVar22 = (Select *)&pEVar21->x;
    }
    iVar17 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar22->pEList)->pList->nExpr;
  }
LAB_00160f37:
  if (iVar25 != iVar17) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
LAB_00160f4c:
  iVar25 = 2;
  if (pParse->nErr == 0) {
    iVar25 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar25;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a; 
      pExpr->op = TK_COLUMN;
      pExpr->pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
          zTable = pExpr->pLeft->u.zToken;
          zColumn = pRight->u.zToken;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pExpr->pLeft->u.zToken;
          zTable = pRight->pLeft->u.zToken;
          zColumn = pRight->pRight->u.zToken;
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely|EP_Skip);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
      }
      if( is_agg && (pNC->ncFlags & NC_AllowAgg)==0 ){
        sqlite3ErrorMsg(pParse, "misuse of aggregate function %.*s()", nId,zId);
        pNC->nErr++;
        is_agg = 0;
      }else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                && pParse->explain==0
#endif
      ){
        sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
        pNC->nErr++;
      }else if( wrong_num_args ){
        sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
             nId, zId);
        pNC->nErr++;
      }
      if( is_agg ) pNC->ncFlags &= ~NC_AllowAgg;
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
        NameContext *pNC2 = pNC;
        pExpr->op = TK_AGG_FUNCTION;
        pExpr->op2 = 0;
        while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
          pExpr->op2++;
          pNC2 = pNC2->pNext;
        }
        assert( pDef!=0 );
        if( pNC2 ){
          assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
          testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
          pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

        }
        pNC->ncFlags |= NC_AllowAgg;
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_IS:
    case TK_ISNOT: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}